

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O0

ostream * ExchCXX::operator<<(ostream *out,Kernel kern)

{
  ostream *in_RDI;
  BidirectionalMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExchCXX::Kernel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<ExchCXX::Kernel>_>
  *this;
  ostream *local_8;
  
  this = (BidirectionalMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExchCXX::Kernel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<ExchCXX::Kernel>_>
          *)&stack0xffffffffffffffd0;
  local_8 = in_RDI;
  BidirectionalMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ExchCXX::Kernel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<ExchCXX::Kernel>_>
  ::key(this,(Kernel)((ulong)in_RDI >> 0x20));
  std::operator<<(in_RDI,(string *)this);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return local_8;
}

Assistant:

std::ostream& operator<<( std::ostream& out, Kernel kern ) {
  out << kernel_map.key(kern);
  return out;
}